

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNDepartureSet<wchar_t> * __thiscall
Centaurus::CATNDepartureSetFactory<wchar_t>::build_departure_set
          (CATNDepartureSet<wchar_t> *__return_storage_ptr__,CATNDepartureSetFactory<wchar_t> *this)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  wchar_t *pwVar2;
  _Self *__x;
  reference this_00;
  CharClass<wchar_t> *pCVar3;
  CATNDeparture<wchar_t> *t_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
  *__range3;
  CATNClosure closure;
  Range<wchar_t> atomic_range;
  iterator iStack_d0;
  wchar_t atomic_range_end;
  wchar_t local_c4;
  iterator iStack_c0;
  wchar_t atomic_range_start;
  _Self local_b8;
  iterator i;
  undefined1 local_88 [8];
  IndexVector borders_for_one_tr;
  CATNDeparture<wchar_t> *t;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
  *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> borders;
  CATNDepartureSetFactory<wchar_t> *this_local;
  CATNDepartureSet<wchar_t> *deptset;
  
  borders._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
  __end0 = std::
           vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
           ::begin(&this->m_departures);
  t = (CATNDeparture<wchar_t> *)
      std::
      vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
      ::end(&this->m_departures);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Centaurus::CATNDeparture<wchar_t>_*,_std::vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>_>
                                     *)&t), bVar1) {
    borders_for_one_tr.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
         = (pointer)__gnu_cxx::
                    __normal_iterator<Centaurus::CATNDeparture<wchar_t>_*,_std::vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>_>
                    ::operator*(&__end0);
    pCVar3 = CATNDeparture<wchar_t>::label
                       ((CATNDeparture<wchar_t> *)
                        borders_for_one_tr.super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    CharClass<wchar_t>::collect_borders((IndexVector *)local_88,pCVar3);
    __first = std::vector<int,_std::allocator<int>_>::cbegin
                        ((vector<int,_std::allocator<int>_> *)&borders_for_one_tr);
    __last = std::vector<int,_std::allocator<int>_>::cend
                       ((vector<int,_std::allocator<int>_> *)&borders_for_one_tr);
    std::set<int,std::less<int>,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((set<int,std::less<int>,std::allocator<int>> *)&__range2,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               __first._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               __last._M_current);
    IndexVector::~IndexVector((IndexVector *)local_88);
    __gnu_cxx::
    __normal_iterator<Centaurus::CATNDeparture<wchar_t>_*,_std::vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  i._M_node._7_1_ = 0;
  CATNDepartureSet<wchar_t>::CATNDepartureSet(__return_storage_ptr__);
  local_b8._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::cbegin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
  while( true ) {
    iStack_c0 = std::set<int,_std::less<int>,_std::allocator<int>_>::cend
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
    bVar1 = std::operator!=(&local_b8,&stack0xffffffffffffff40);
    if (!bVar1) break;
    pwVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_b8);
    local_c4 = *pwVar2;
    __x = std::_Rb_tree_const_iterator<int>::operator++(&local_b8);
    iStack_d0 = std::set<int,_std::less<int>,_std::allocator<int>_>::cend
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
    bVar1 = std::operator==(__x,&stack0xffffffffffffff30);
    if (bVar1) break;
    pwVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_b8);
    Range<wchar_t>::Range
              ((Range<wchar_t> *)&closure._M_t._M_impl.super__Rb_tree_header._M_node_count,local_c4,
               *pwVar2);
    std::
    set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
    ::set((set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
           *)&__range3);
    __end0_1 = std::
               vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
               ::begin(&this->m_departures);
    t_1 = (CATNDeparture<wchar_t> *)
          std::
          vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
          ::end(&this->m_departures);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<Centaurus::CATNDeparture<wchar_t>_*,_std::vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>_>
                               *)&t_1), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<Centaurus::CATNDeparture<wchar_t>_*,_std::vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>_>
                ::operator*(&__end0_1);
      pCVar3 = CATNDeparture<wchar_t>::label(this_00);
      bVar1 = CharClass<wchar_t>::includes
                        (pCVar3,(Range<wchar_t> *)
                                &closure._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar1) {
        closure_add(this,(CATNClosure *)&__range3,this_00);
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::CATNDeparture<wchar_t>_*,_std::vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>_>
      ::operator++(&__end0_1);
    }
    bVar1 = std::
            set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
            ::empty((set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
                     *)&__range3);
    if (!bVar1) {
      std::
      vector<std::pair<Centaurus::CharClass<wchar_t>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>,std::allocator<std::pair<Centaurus::CharClass<wchar_t>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>>>
      ::
      emplace_back<Centaurus::Range<wchar_t>&,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>&>
                ((vector<std::pair<Centaurus::CharClass<wchar_t>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>,std::allocator<std::pair<Centaurus::CharClass<wchar_t>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>>>
                  *)&__return_storage_ptr__->
                     super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                 ,(Range<wchar_t> *)&closure._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
                  *)&__range3);
    }
    std::
    set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
    ::~set((set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
            *)&__range3);
    Range<wchar_t>::~Range
              ((Range<wchar_t> *)&closure._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  i._M_node._7_1_ = 1;
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

CATNDepartureSet<TCHAR> build_departure_set()
    {
        std::set<int> borders;

        for (const auto& t : m_departures)
        {
            IndexVector borders_for_one_tr = t.label().collect_borders();

            borders.insert(borders_for_one_tr.cbegin(), borders_for_one_tr.cend());
        }

        CATNDepartureSet<TCHAR> deptset;

        for (auto i = borders.cbegin(); i != borders.cend();)
        {
            TCHAR atomic_range_start = *i;
            if (++i == borders.cend()) break;
            TCHAR atomic_range_end = *i;

            Range<TCHAR> atomic_range(atomic_range_start, atomic_range_end);

            CATNClosure closure;

            for (const auto& t : m_departures)
            {
                if (t.label().includes(atomic_range))
                {
                    /*if (!closure.empty())
                    {
                        std::wcerr << L"Closure not empty." << std::endl;
                        std::wcerr << closure << std::endl;
                        std::wcerr << t.priority() << std::endl;
                    }
                    if (scan_closure(closure, t.priority()))
                    {
                        closure.emplace(t.path(), t.color(), t.priority());
                    }
                    else
                    {
                        std::wcerr << L"Departure blocked." << std::endl;
                        std::wcerr << closure << std::endl;
                        std::wcerr << t.priority() << std::endl;
                    }*/
                    closure_add(closure, t);
                }
            }

            if (!closure.empty())
            {
                deptset.emplace_back(atomic_range, closure);
            }
        }
        //std::wcout << deptset << std::endl;
        return deptset;
    }